

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.hpp
# Opt level: O0

string_view __thiscall mg::data::MappedHfa::entry_data(MappedHfa *this,int index)

{
  uint uVar1;
  const_reference pvVar2;
  size_type sVar3;
  element_type *this_00;
  uint8_t *puVar4;
  size_t offset_bytes;
  size_t header_size_bytes;
  value_type *entry;
  int index_local;
  MappedHfa *this_local;
  
  pvVar2 = std::
           vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
           ::at(&this->_entries,(long)index);
  sVar3 = std::
          vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
          ::size(&this->_entries);
  uVar1 = pvVar2->offset;
  this_00 = std::__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  puVar4 = fs::MappedFile::data(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (char *)(puVar4 + (sVar3 << 7 | 0x10) + (ulong)uVar1),(ulong)pvVar2->size);
  return _this_local;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t header_size_bytes =
        sizeof(Hfa::FileHeader) +
        sizeof(Hfa::PackedEntryHeader) * _entries.size();
    const size_t offset_bytes = header_size_bytes + entry.offset;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        entry.size);
  }